

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O2

void __thiscall Peer::Peer(Peer *this,P2PSocket *socket,SocketResource peer,int num)

{
  Socket __fd;
  int iVar1;
  ostream *poVar2;
  socklen_t len;
  sockaddr_in address;
  socklen_t local_9c;
  undefined1 local_98 [8];
  char acStack_90 [8];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  SocketResource local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->m_master = socket;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_ip)._M_dataplus._M_p = (pointer)&(this->m_ip).field_2;
  (this->m_ip)._M_string_length = 0;
  (this->m_ip).field_2._M_local_buf[0] = '\0';
  (this->m_socket).m_socket = peer.m_socket;
  this->m_flags = '\0';
  local_98._0_2_ = 0;
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  acStack_90[0] = '\0';
  acStack_90[1] = '\0';
  acStack_90[2] = '\0';
  acStack_90[3] = '\0';
  acStack_90[4] = '\0';
  acStack_90[5] = '\0';
  acStack_90[6] = '\0';
  acStack_90[7] = '\0';
  local_9c = 0x10;
  local_44.m_socket = peer.m_socket;
  __fd = SocketResource::resource(&local_44);
  iVar1 = getpeername(__fd,(sockaddr *)local_98,&local_9c);
  if (iVar1 == -1) {
    std::__cxx11::to_string(&local_88,num);
    std::operator+(&local_68,"New peer connection ",&local_88);
    std::operator+(&local_40,&local_68," failed.");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  this->m_port = local_98._2_2_ << 8 | (ushort)local_98._2_2_ >> 8;
  inet_ntoa((in_addr)local_98._4_4_);
  std::__cxx11::string::assign((char *)&this->m_ip);
  std::operator+(&local_68,&this->m_ip,":");
  std::__cxx11::to_string(&local_88,(uint)this->m_port);
  std::operator+(&local_40,&local_68,&local_88);
  std::__cxx11::string::operator=((string *)&this->m_name,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  this->m_connected = true;
  return;
}

Assistant:

Peer::Peer(P2PSocket *socket, SocketResource peer, int num)
    : m_master(socket), m_socket(peer), m_flags{0}
{
    struct sockaddr_in address;
    std::memset(&address, 0, sizeof address);
    socklen_t len = sizeof(address);
    int ret = ::getpeername(peer.resource(), (struct sockaddr *)&address, &len);
    if (ret == -1)
        std::cout << "New peer connection " + std::to_string(num) + " failed." << std::endl;
    m_port = ntohs(address.sin_port);
    m_ip = ::inet_ntoa(address.sin_addr);
    m_name = m_ip + ":" + std::to_string(m_port);
    m_connected = true;
}